

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  u8 uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  undefined8 uVar5;
  ulong uVar6;
  uint *pCell;
  CellInfo info;
  CellInfo local_50;
  
  if ((int)CONCAT71(in_register_00000009,eType) == 4) {
    uVar3 = *(uint *)pPage->aData;
    if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) == iFrom)
    {
      *(Pgno *)pPage->aData =
           iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
      return 0;
    }
    uVar5 = 0xdafc;
  }
  else {
    uVar1 = pPage->isInit;
    btreeInitPage(pPage);
    uVar2 = pPage->nCell;
    if (uVar2 == 0) {
      uVar6 = 0;
LAB_00127e80:
      if ((uint)uVar6 != (uint)uVar2) goto LAB_00127ed9;
    }
    else {
      uVar6 = 0;
      do {
        pCell = (uint *)(pPage->aData +
                        (CONCAT11(pPage->aCellIdx[uVar6 * 2],pPage->aCellIdx[uVar6 * 2 + 1]) &
                        pPage->maskPage));
        if (eType == '\x03') {
          btreeParseCellPtr(pPage,(u8 *)pCell,&local_50);
          uVar4 = (ulong)local_50.iOverflow;
          if ((uVar4 != 0) && ((u8 *)((long)pCell + uVar4 + 3) <= pPage->aData + pPage->maskPage)) {
            uVar3 = *(uint *)((long)pCell + uVar4);
            if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ==
                iFrom) {
              *(uint *)((long)pCell + uVar4) =
                   iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
              goto LAB_00127ed9;
            }
          }
        }
        else {
          uVar3 = *pCell;
          if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ==
              iFrom) {
            *pCell = iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
            goto LAB_00127e80;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    if (eType == '\x05') {
      uVar3 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
      if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) == iFrom
         ) {
        *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
             iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
LAB_00127ed9:
        pPage->isInit = uVar1;
        return 0;
      }
    }
    uVar5 = 0xdb1e;
  }
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar5,
              "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  return 0xb;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_BKPT;
    }
    put4byte(pPage->aData, iTo);
  }else{
    u8 isInitOrig = pPage->isInit;
    int i;
    int nCell;

    btreeInitPage(pPage);
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        btreeParseCellPtr(pPage, pCell, &info);
        if( info.iOverflow
         && pCell+info.iOverflow+3<=pPage->aData+pPage->maskPage
         && iFrom==get4byte(&pCell[info.iOverflow])
        ){
          put4byte(&pCell[info.iOverflow], iTo);
          break;
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }
  
    if( i==nCell ){
      if( eType!=PTRMAP_BTREE || 
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_BKPT;
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }

    pPage->isInit = isInitOrig;
  }
  return SQLITE_OK;
}